

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordManager.cpp
# Opt level: O0

void __thiscall
RecordManager::FindandPrint
          (RecordManager *this,STMT *S,set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *ps)

{
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> local_150;
  STMT local_120;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> local_c8;
  STMT local_98;
  undefined1 local_50 [8];
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> target;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *ps_local;
  STMT *S_local;
  RecordManager *this_local;
  
  target._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)ps;
  STMT::STMT(&local_98,S);
  std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::set(&local_c8,ps);
  FindSuchRecord((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)local_50,this,&local_98,
                 &local_c8);
  std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set(&local_c8);
  STMT::~STMT(&local_98);
  STMT::STMT(&local_120,S);
  std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::set
            (&local_150,(set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)local_50);
  PrintRecord(this,&local_120,&local_150);
  std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set(&local_150);
  STMT::~STMT(&local_120);
  std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set
            ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)local_50);
  return;
}

Assistant:

void RecordManager::FindandPrint(STMT S, set<Addr>ps) {
	set<Addr> target = this->FindSuchRecord(S, ps);
	this->PrintRecord(S, target);
}